

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O1

void __thiscall Assimp::Blender::SectionParser::Next(SectionParser *this)

{
  string *this_00;
  StreamReaderAny *pSVar1;
  int iVar2;
  uint uVar3;
  unsigned_long uVar4;
  Logger *this_01;
  runtime_error *this_02;
  long lVar5;
  char tmp [4];
  char local_4c [4];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  StreamReader<true,_true>::SetPtr
            (this->stream,this->stream->buffer + (ulong)(this->current).start + (this->current).size
            );
  local_4c[0] = StreamReader<true,_true>::Get<signed_char>(this->stream);
  local_4c[1] = StreamReader<true,_true>::Get<signed_char>(this->stream);
  local_4c[2] = StreamReader<true,_true>::Get<signed_char>(this->stream);
  local_4c[3] = StreamReader<true,_true>::Get<signed_char>(this->stream);
  lVar5 = 4;
  if ((local_4c[3] == '\0') && (lVar5 = 3, local_4c[2] == '\0')) {
    lVar5 = 2 - (ulong)(local_4c[1] == '\0');
  }
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,local_4c,local_4c + lVar5);
  this_00 = &(this->current).id;
  ::std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  iVar2 = StreamReader<true,_true>::Get<int>(this->stream);
  (this->current).size = (long)iVar2;
  if (this->ptr64 == true) {
    uVar4 = StreamReader<true,_true>::Get<unsigned_long>(this->stream);
  }
  else {
    uVar3 = StreamReader<true,_true>::Get<unsigned_int>(this->stream);
    uVar4 = (unsigned_long)uVar3;
  }
  (this->current).address.val = uVar4;
  uVar3 = StreamReader<true,_true>::Get<int>(this->stream);
  (this->current).dna_index = uVar3;
  iVar2 = StreamReader<true,_true>::Get<int>(this->stream);
  (this->current).num = (long)iVar2;
  pSVar1 = this->stream;
  (this->current).start = *(int *)&pSVar1->current - *(int *)&pSVar1->buffer;
  if ((this->current).size <= (ulong)(uint)(*(int *)&pSVar1->limit - *(int *)&pSVar1->current)) {
    this_01 = DefaultLogger::get();
    Logger::debug(this_01,(this_00->_M_dataplus)._M_p);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"BLEND: invalid size of file block","");
  ::std::runtime_error::runtime_error(this_02,(string *)local_48);
  *(undefined ***)this_02 = &PTR__runtime_error_00900168;
  __cxa_throw(this_02,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SectionParser :: Next()
{
    stream.SetCurrentPos(current.start + current.size);

    const char tmp[] = {
        (const char)stream.GetI1(),
        (const char)stream.GetI1(),
        (const char)stream.GetI1(),
        (const char)stream.GetI1()
    };
    current.id = std::string(tmp,tmp[3]?4:tmp[2]?3:tmp[1]?2:1);

    current.size = stream.GetI4();
    current.address.val = ptr64 ? stream.GetU8() : stream.GetU4();

    current.dna_index = stream.GetI4();
    current.num = stream.GetI4();

    current.start = stream.GetCurrentPos();
    if (stream.GetRemainingSizeToLimit() < current.size) {
        throw DeadlyImportError("BLEND: invalid size of file block");
    }

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    ASSIMP_LOG_DEBUG(current.id);
#endif
}